

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
* __thiscall
wallet::anon_unknown_5::WalletImpl::getNewDestination
          (Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
           *__return_storage_ptr__,WalletImpl *this,OutputType type,string *label)

{
  CWallet *this_00;
  pointer pcVar1;
  string label_00;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock6;
  undefined8 in_stack_ffffffffffffff98;
  RecursiveMutex *pRVar2;
  bool bVar3;
  undefined7 in_stack_ffffffffffffffa9;
  long *plVar4;
  long local_40 [2];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar2 = &((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->cs_wallet;
  bVar3 = false;
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffffa0);
  this_00 = (this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar1 = (label->_M_dataplus)._M_p;
  plVar4 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffffb0,pcVar1,pcVar1 + label->_M_string_length);
  label_00._M_string_length = (size_type)pRVar2;
  label_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff98;
  label_00.field_2._M_local_buf[0] = bVar3;
  label_00.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffffa9;
  label_00.field_2._8_8_ = plVar4;
  CWallet::GetNewDestination(__return_storage_ptr__,this_00,type,label_00);
  if (plVar4 != local_40) {
    operator_delete(plVar4,local_40[0] + 1);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffffa0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<CTxDestination> getNewDestination(const OutputType type, const std::string& label) override
    {
        LOCK(m_wallet->cs_wallet);
        return m_wallet->GetNewDestination(type, label);
    }